

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O3

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)

{
  uint *puVar1;
  undefined8 uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  uint32_t extraout_EAX_01;
  uint32_t extraout_EAX_02;
  uint32_t extraout_EAX_03;
  uint32_t extraout_EAX_04;
  uint32_t extraout_EAX_05;
  uint32_t extraout_EAX_06;
  uint32_t extraout_EAX_07;
  uint32_t extraout_EAX_08;
  void *pvVar5;
  byte *pbVar6;
  undefined8 *puVar7;
  byte bVar8;
  Lib_IntVector_Intrinsics_vec256 *palVar9;
  undefined7 in_register_00000039;
  ulong uVar10;
  
  uVar10 = CONCAT71(in_register_00000039,a);
  if (a < 0xc) {
    return *(uint32_t *)(&DAT_001dc5f0 + (ulong)a * 4);
  }
  EverCrypt_Hash_Incremental_hash_len_cold_1();
  block_len((Spec_Hash_Definitions_hash_alg)uVar10);
  uVar4 = block_len((Spec_Hash_Definitions_hash_alg)uVar10);
  puVar7 = (undefined8 *)(ulong)uVar4;
  palVar9 = (Lib_IntVector_Intrinsics_vec256 *)0x1;
  pvVar5 = calloc((size_t)puVar7,1);
  switch(uVar10 & 0xffffffff) {
  case 0:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    bVar8 = 2;
    break;
  case 1:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    bVar8 = 3;
    break;
  case 2:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    bVar8 = 4;
    break;
  case 3:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    bVar8 = 5;
    break;
  case 4:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(5,4);
    bVar8 = 1;
    break;
  case 5:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(4,4);
    bVar8 = 0;
    break;
  case 6:
    _Var3 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var3) {
      bVar8 = 0xb;
      palVar9 = (Lib_IntVector_Intrinsics_vec256 *)Hacl_Hash_Blake2s_Simd128_malloc_with_key();
    }
    else {
      palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,4);
      bVar8 = 10;
    }
    break;
  case 7:
    _Var3 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var3) {
      bVar8 = 0xd;
      palVar9 = Hacl_Hash_Blake2b_Simd256_malloc_with_key();
    }
    else {
      palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,8);
      bVar8 = 0xc;
    }
    break;
  case 8:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar8 = 7;
    break;
  case 9:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar8 = 6;
    break;
  case 10:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar8 = 8;
    break;
  case 0xb:
    palVar9 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar8 = 9;
    break;
  default:
    EverCrypt_Hash_Incremental_malloc_cold_1();
    if (0xd < (byte)puVar7) {
      block_len_cold_1();
      switch((ulong)puVar7 & 0xff) {
      case 0:
        Hacl_Hash_MD5_init((uint32_t *)palVar9);
        return extraout_EAX_04;
      case 1:
        Hacl_Hash_SHA1_init((uint32_t *)palVar9);
        return extraout_EAX_05;
      case 2:
        Hacl_Hash_SHA2_sha224_init((uint32_t *)palVar9);
        return extraout_EAX_02;
      case 3:
        Hacl_Hash_SHA2_sha256_init((uint32_t *)palVar9);
        return extraout_EAX_03;
      case 4:
        Hacl_Hash_SHA2_sha384_init((uint64_t *)palVar9);
        return extraout_EAX_00;
      case 5:
        Hacl_Hash_SHA2_sha512_init((uint64_t *)palVar9);
        return extraout_EAX_06;
      case 6:
      case 7:
      case 8:
      case 9:
        pvVar5 = memset(palVar9,0,200);
        return (uint32_t)pvVar5;
      case 10:
        Hacl_Hash_Blake2s_init((uint32_t *)palVar9,0,0x20);
        return extraout_EAX_08;
      case 0xb:
        Hacl_Hash_Blake2s_Simd128_init((Lib_IntVector_Intrinsics_vec128 *)palVar9,0,0x20);
        return extraout_EAX;
      case 0xc:
        Hacl_Hash_Blake2b_init((uint64_t *)palVar9,0,0x40);
        return extraout_EAX_01;
      case 0xd:
        Hacl_Hash_Blake2b_Simd256_init(palVar9,0,0x40);
        return extraout_EAX_07;
      default:
        init_cold_1();
        puVar1 = (uint *)*puVar7;
        uVar2 = puVar7[1];
        alg_of_state((EverCrypt_Hash_state_s *)(ulong)*puVar1);
        uVar4 = init((EVP_PKEY_CTX *)(ulong)*puVar1);
        *puVar7 = puVar1;
        puVar7[1] = uVar2;
        puVar7[2] = 0;
        return uVar4;
      }
    }
    return *(uint32_t *)(&DAT_001dc620 + ((ulong)puVar7 & 0xff) * 4);
  }
  pbVar6 = (byte *)malloc(0x10);
  *pbVar6 = bVar8;
  *(Lib_IntVector_Intrinsics_vec256 **)(pbVar6 + 8) = palVar9;
  puVar7 = (undefined8 *)malloc(0x18);
  *puVar7 = pbVar6;
  puVar7[1] = pvVar5;
  puVar7[2] = 0;
  init((EVP_PKEY_CTX *)(ulong)bVar8);
  return (uint32_t)puVar7;
}

Assistant:

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        return MD5_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        return SHA1_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        return SHA2_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return SHA2_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return SHA2_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return SHA2_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        return SHA3_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        return SHA3_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        return SHA3_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        return SHA3_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        return BLAKE2S_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        return BLAKE2B_HASH_LEN;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}